

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O0

void __thiscall TgBot::Url::Url(Url *this,string *url)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  char *pcVar7;
  char c;
  size_t count;
  size_t i;
  bool isQueryParsed;
  bool isPathParsed;
  bool isHostParsed;
  bool isProtocolParsed;
  string *url_local;
  Url *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->host);
  std::__cxx11::string::string((string *)&this->path);
  std::__cxx11::string::string((string *)&this->query);
  std::__cxx11::string::string((string *)&this->fragment);
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  count = 0;
  uVar6 = std::__cxx11::string::length();
  for (; count < uVar6; count = count + 1) {
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)url);
    cVar1 = *pcVar7;
    if (bVar2) {
      if (bVar3) {
        if (bVar4) {
          if (bVar5) {
            std::__cxx11::string::operator+=((string *)&this->fragment,cVar1);
          }
          else if (cVar1 == '#') {
            bVar5 = true;
          }
          else {
            std::__cxx11::string::operator+=((string *)&this->query,cVar1);
          }
        }
        else if (cVar1 == '?') {
          bVar4 = true;
        }
        else if (cVar1 == '#') {
          bVar5 = true;
          bVar4 = true;
        }
        else {
          std::__cxx11::string::operator+=((string *)&this->path,cVar1);
        }
      }
      else if (cVar1 == '/') {
        bVar3 = true;
        std::__cxx11::string::operator+=((string *)&this->path,'/');
      }
      else if (cVar1 == '?') {
        bVar4 = true;
        bVar3 = true;
        std::__cxx11::string::operator+=((string *)&this->path,'/');
      }
      else if (cVar1 == '#') {
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        std::__cxx11::string::operator+=((string *)&this->path,'/');
      }
      else {
        std::__cxx11::string::operator+=((string *)&this->host,cVar1);
      }
    }
    else if (cVar1 == ':') {
      bVar2 = true;
      count = count + 2;
    }
    else {
      std::__cxx11::string::operator+=((string *)this,cVar1);
    }
  }
  return;
}

Assistant:

Url::Url(const string& url) {
    bool isProtocolParsed = false;
    bool isHostParsed = false;
    bool isPathParsed = false;
    bool isQueryParsed = false;

    for (size_t i = 0, count = url.length(); i < count; ++i) {
        char c = url[i];

        if (!isProtocolParsed) {
            if (c == ':') {
                isProtocolParsed = true;
                i += 2;
            } else {
                protocol += c;
            }
        } else if (!isHostParsed) {
            if (c == '/') {
                isHostParsed = true;
                path += '/';
            } else if (c == '?') {
                isHostParsed = isPathParsed = true;
                path += '/';
            } else if (c == '#') {
                isHostParsed = isPathParsed = isQueryParsed = true;
                path += '/';
            } else {
                host += c;
            }
        } else if (!isPathParsed) {
            if (c == '?') {
                isPathParsed = true;
            } else if (c == '#') {
                isPathParsed = isQueryParsed = true;
            } else {
                path += c;
            }
        } else if (!isQueryParsed) {
            if (c == '#') {
                isQueryParsed = true;
            } else {
                query += c;
            }
        } else {
            fragment += c;
        }
    }
}